

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.h
# Opt level: O2

void __thiscall blas::quaternion::quaternion(quaternion *this,initializer_list<float> list)

{
  (this->data).super_matrix<4UL,_1UL>.data[0] = 0.0;
  (this->data).super_matrix<4UL,_1UL>.data[1] = 0.0;
  (this->data).super_matrix<4UL,_1UL>.data[2] = 0.0;
  (this->data).super_matrix<4UL,_1UL>.data[3] = 0.0;
  (this->data).super_matrix<4UL,_1UL>._vptr_matrix =
       (_func_int **)&PTR_to_string_abi_cxx11__00107d28;
  operator=(this,list);
  return;
}

Assistant:

matrix() = default;